

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O1

int perform(CURLM *multi)

{
  int in_EAX;
  int iVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  timeval tVar5;
  timeval older;
  timeval older_00;
  int maxfd;
  int handles;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  iVar2 = 0;
  do {
    local_1d0 = -99;
    local_1c8.tv_sec = 0;
    local_1c8.tv_usec = 100000;
    iVar1 = curl_multi_perform(multi,&local_1cc);
    if (iVar1 == 0) {
      iVar1 = iVar2;
      if (local_1cc < 0) {
        fprintf(_stderr,
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
                ,0x2d);
        iVar1 = 0x7a;
      }
    }
    else {
      perform_cold_1();
    }
    cVar4 = '\x01';
    iVar2 = iVar1;
    if (iVar1 == 0) {
      tVar5 = tutil_tvnow();
      older.tv_usec = tv_test_start.tv_usec;
      older.tv_sec = tv_test_start.tv_sec;
      lVar3 = tutil_tvdiff(tVar5,older);
      if (lVar3 < 0xea61) {
        if (local_1cc == 0) {
          iVar1 = 0;
          cVar4 = '\x02';
          iVar2 = in_EAX;
        }
        else {
          local_b8.__fds_bits[0xe] = 0;
          local_b8.__fds_bits[0xf] = 0;
          local_b8.__fds_bits[0xc] = 0;
          local_b8.__fds_bits[0xd] = 0;
          local_b8.__fds_bits[10] = 0;
          local_b8.__fds_bits[0xb] = 0;
          local_b8.__fds_bits[8] = 0;
          local_b8.__fds_bits[9] = 0;
          local_b8.__fds_bits[6] = 0;
          local_b8.__fds_bits[7] = 0;
          local_b8.__fds_bits[4] = 0;
          local_b8.__fds_bits[5] = 0;
          local_b8.__fds_bits[2] = 0;
          local_b8.__fds_bits[3] = 0;
          local_b8.__fds_bits[0] = 0;
          local_b8.__fds_bits[1] = 0;
          local_138.__fds_bits[0] = 0;
          local_138.__fds_bits[1] = 0;
          local_138.__fds_bits[2] = 0;
          local_138.__fds_bits[3] = 0;
          local_138.__fds_bits[4] = 0;
          local_138.__fds_bits[5] = 0;
          local_138.__fds_bits[6] = 0;
          local_138.__fds_bits[7] = 0;
          local_138.__fds_bits[8] = 0;
          local_138.__fds_bits[9] = 0;
          local_138.__fds_bits[10] = 0;
          local_138.__fds_bits[0xb] = 0;
          local_138.__fds_bits[0xc] = 0;
          local_138.__fds_bits[0xd] = 0;
          local_138.__fds_bits[0xe] = 0;
          local_138.__fds_bits[0xf] = 0;
          local_1b8.__fds_bits[0] = 0;
          local_1b8.__fds_bits[1] = 0;
          local_1b8.__fds_bits[2] = 0;
          local_1b8.__fds_bits[3] = 0;
          local_1b8.__fds_bits[4] = 0;
          local_1b8.__fds_bits[5] = 0;
          local_1b8.__fds_bits[6] = 0;
          local_1b8.__fds_bits[7] = 0;
          local_1b8.__fds_bits[8] = 0;
          local_1b8.__fds_bits[9] = 0;
          local_1b8.__fds_bits[10] = 0;
          local_1b8.__fds_bits[0xb] = 0;
          local_1b8.__fds_bits[0xc] = 0;
          local_1b8.__fds_bits[0xd] = 0;
          local_1b8.__fds_bits[0xe] = 0;
          local_1b8.__fds_bits[0xf] = 0;
          iVar1 = curl_multi_fdset(multi,&local_b8,&local_138,&local_1b8,&local_1d0);
          if (iVar1 == 0) {
            iVar1 = 0;
            if (local_1d0 < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
                      ,0x3c);
              iVar1 = 0x7a;
            }
          }
          else {
            perform_cold_3();
          }
          iVar2 = iVar1;
          if (iVar1 == 0) {
            iVar2 = select_wrapper(local_1d0 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
            if (iVar2 == -1) {
              perform_cold_4();
              iVar1 = 0x79;
              iVar2 = iVar1;
            }
            else {
              tVar5 = tutil_tvnow();
              older_00.tv_usec = tv_test_start.tv_usec;
              older_00.tv_sec = tv_test_start.tv_sec;
              lVar3 = tutil_tvdiff(tVar5,older_00);
              iVar1 = 0;
              if (60000 < lVar3) {
                perform_cold_5();
                in_EAX = 0x7d;
                iVar1 = 0x7d;
              }
              cVar4 = 60000 < lVar3;
              iVar2 = in_EAX;
            }
          }
        }
      }
      else {
        perform_cold_2();
        iVar1 = 0x7d;
        iVar2 = iVar1;
      }
    }
    in_EAX = iVar2;
    iVar2 = iVar1;
  } while (cVar4 == '\0');
  if (cVar4 == '\x02') {
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}